

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::StringTree>::truncate
          (ArrayBuilder<kj::StringTree> *this,char *__file,__off_t __length)

{
  StringTree *pSVar1;
  int in_EAX;
  int extraout_EAX;
  StringTree *this_00;
  
  pSVar1 = this->ptr;
  while (pSVar1 + (long)__file < this->pos) {
    this_00 = this->pos + -1;
    this->pos = this_00;
    StringTree::~StringTree(this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }